

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chardev.c
# Opt level: O0

LispPTR CHAR_bouts(LispPTR *args)

{
  int iVar1;
  DLword *pDVar2;
  void *page;
  LispPTR *pLVar3;
  int *piVar4;
  ssize_t x;
  bool bVar5;
  uint local_58;
  uint local_54;
  uint local_50;
  uint local_4c;
  uint local_3c;
  uint local_38;
  int nbytes;
  char *buffer;
  ssize_t rval;
  int fd;
  LispPTR *args_local;
  
  Lisp_errno = (int *)NativeAligned4FromLAddr(args[4]);
  iVar1 = _setjmp((__jmp_buf_tag *)jmpbuf);
  if (iVar1 == 0) {
    if ((*args & 0xfff0000) == 0xe0000) {
      local_38 = *args & 0xffff;
    }
    else {
      if ((*args & 0xfff0000) == 0xf0000) {
        local_3c = *args | 0xffff0000;
      }
      else {
        pLVar3 = NativeAligned4FromLAddr(*args);
        local_3c = *pLVar3;
      }
      local_38 = local_3c;
    }
    pDVar2 = NativeAligned2FromLAddr(args[1]);
    if ((args[2] & 0xfff0000) == 0xe0000) {
      local_4c = args[2] & 0xffff;
    }
    else {
      if ((args[2] & 0xfff0000) == 0xf0000) {
        local_50 = args[2] | 0xffff0000;
      }
      else {
        pLVar3 = NativeAligned4FromLAddr(args[2]);
        local_50 = *pLVar3;
      }
      local_4c = local_50;
    }
    page = (void *)((long)pDVar2 + (ulong)local_4c);
    if ((args[3] & 0xfff0000) == 0xe0000) {
      local_54 = args[3] & 0xffff;
    }
    else {
      if ((args[3] & 0xfff0000) == 0xf0000) {
        local_58 = args[3] | 0xffff0000;
      }
      else {
        pLVar3 = NativeAligned4FromLAddr(args[3]);
        local_58 = *pLVar3;
      }
      local_54 = local_58;
    }
    word_swap_page(page,(int)(local_54 + 3) >> 2);
    alarm(TIMEOUT_TIME);
    do {
      piVar4 = __errno_location();
      *piVar4 = 0;
      x = write(local_38,page,(long)(int)local_54);
      bVar5 = false;
      if (x == -1) {
        piVar4 = __errno_location();
        bVar5 = *piVar4 == 4;
      }
    } while (bVar5);
    alarm(0);
    word_swap_page(page,(int)(local_54 + 3) >> 2);
    if (x == -1) {
      piVar4 = __errno_location();
      *Lisp_errno = *piVar4;
      args_local._4_4_ = 0;
    }
    else if (x == 0) {
      *Lisp_errno = 0xb;
      args_local._4_4_ = 0;
    }
    else {
      args_local._4_4_ = GetSmallp(x);
    }
  }
  else {
    *Lisp_errno = 100;
    args_local._4_4_ = 0;
  }
  return args_local._4_4_;
}

Assistant:

LispPTR CHAR_bouts(LispPTR *args)
{
#ifndef DOS
  int fd;
  ssize_t rval;
  char *buffer;
  int nbytes;
  Lisp_errno = (int *)NativeAligned4FromLAddr(args[4]);
  ERRSETJMP(NIL);
  fd = LispNumToCInt(args[0]);
  buffer = ((char *)(NativeAligned2FromLAddr(args[1]))) + LispNumToCInt(args[2]);
  nbytes = LispNumToCInt(args[3]);
/* Write PAGE_SIZE bytes file contents from filepointer. */
#ifdef BYTESWAP
  word_swap_page((unsigned short *)buffer, (nbytes + 3) >> 2);
#endif /* BYTESWAP */

  TIMEOUT(rval = write(fd, buffer, nbytes));
#ifdef BYTESWAP
  word_swap_page((unsigned short *)buffer, (nbytes + 3) >> 2);
#endif /* BYTESWAP */

  if (rval == -1) {
    *Lisp_errno = errno;
    return (NIL);
  }
  if (rval == 0) {
    *Lisp_errno = EWOULDBLOCK;
    return (NIL);
  }
  return (GetSmallp(rval));
#endif /* DOS */
}